

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

void __thiscall
StatisticsTracker::StatisticsTracker
          (StatisticsTracker *this,string *name,long count,double minimum,double mean,double maximum
          ,double variance,StatisticsTrackerOptions *options)

{
  undefined3 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  
  this->_count = count;
  DynamicHistogram<double>::DynamicHistogram(&this->_histogram,&options->histogramOptions);
  this->_maximum = maximum;
  this->_mean = mean;
  this->_minimum = minimum;
  std::__cxx11::string::string((string *)&this->_name,(string *)name);
  uVar1 = *(undefined3 *)&(options->histogramOptions).field_0x9;
  (this->_options).histogramOptions.enabled = (options->histogramOptions).enabled;
  *(undefined3 *)&(this->_options).histogramOptions.field_0x9 = uVar1;
  bVar2 = options->doMax;
  bVar3 = options->doMean;
  bVar4 = options->doMin;
  bVar5 = options->doVar;
  uVar1 = *(undefined3 *)&options->field_0x5;
  iVar6 = (options->histogramOptions).binCount;
  iVar7 = (options->histogramOptions).cacheSize;
  (this->_options).doCov = options->doCov;
  (this->_options).doMax = bVar2;
  (this->_options).doMean = bVar3;
  (this->_options).doMin = bVar4;
  (this->_options).doVar = bVar5;
  *(undefined3 *)&(this->_options).field_0x5 = uVar1;
  (this->_options).histogramOptions.binCount = iVar6;
  (this->_options).histogramOptions.cacheSize = iVar7;
  this->_variance = variance;
  return;
}

Assistant:

StatisticsTracker(std::string name = "",
                      long count = 0,
                      double minimum = 0,
                      double mean = 0,
                      double maximum = 0,
                      double variance = 0,
                      StatisticsTrackerOptions const & options = StatisticsTrackerOptions()) :
        _count(count),
        _histogram(DynamicHistogram<double>(options.histogramOptions)),
        _maximum(maximum),
        _mean(mean),
        _minimum(minimum),
        _name(name),
        _options(options),
        _variance(variance)
    {
    }